

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_overwrite_decimal128(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  byte bVar7;
  int iVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  bson_decimal128_t iter_value;
  bson_decimal128_t new_value;
  bson_decimal128_t value;
  bson_t b;
  bson_iter_t iter;
  char local_1b0;
  char cStack_1af;
  char cStack_1ae;
  char cStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  char cStack_1a9;
  char cStack_1a8;
  char cStack_1a7;
  char cStack_1a6;
  char cStack_1a5;
  char cStack_1a4;
  char cStack_1a3;
  char cStack_1a2;
  char cStack_1a1;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined1 local_180 [128];
  undefined1 local_100 [248];
  
  local_188 = 0;
  local_190 = 1;
  uStack_198 = 0;
  local_1a0 = 2;
  bson_init(local_180);
  bVar7 = bson_append_decimal128(local_180,"key",0xffffffff,&local_190);
  if ((bVar7 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1ba,"test_bson_iter_overwrite_decimal128",
            "bson_append_decimal128 (&b, \"key\", -1, &value)");
    abort();
  }
  bVar7 = bson_iter_init_find(local_100,local_180,"key");
  if ((bVar7 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1bb,"test_bson_iter_overwrite_decimal128","bson_iter_init_find (&iter, &b, \"key\")");
    abort();
  }
  iVar8 = bson_iter_type(local_100);
  if (iVar8 != 0x13) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1bc,"test_bson_iter_overwrite_decimal128","BSON_ITER_HOLDS_DECIMAL128 (&iter)");
    abort();
  }
  bson_iter_overwrite_decimal128(local_100,&local_1a0);
  bVar7 = bson_iter_init_find(local_100,local_180,"key");
  if ((bVar7 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1be,"test_bson_iter_overwrite_decimal128","bson_iter_init_find (&iter, &b, \"key\")");
    abort();
  }
  iVar8 = bson_iter_type(local_100);
  if (iVar8 != 0x13) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1bf,"test_bson_iter_overwrite_decimal128","BSON_ITER_HOLDS_DECIMAL128 (&iter)");
    abort();
  }
  bVar7 = bson_iter_decimal128(local_100,&local_1b0);
  if ((bVar7 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1c0,"test_bson_iter_overwrite_decimal128","bson_iter_decimal128 (&iter, &iter_value)")
    ;
    abort();
  }
  cVar9 = -(local_1b0 == (char)local_1a0);
  cVar10 = -(cStack_1af == (char)((ulong)local_1a0 >> 8));
  cVar11 = -(cStack_1ae == (char)((ulong)local_1a0 >> 0x10));
  cVar12 = -(cStack_1ad == (char)((ulong)local_1a0 >> 0x18));
  cVar13 = -(cStack_1ac == (char)((ulong)local_1a0 >> 0x20));
  cVar14 = -(cStack_1ab == (char)((ulong)local_1a0 >> 0x28));
  cVar15 = -(cStack_1aa == (char)((ulong)local_1a0 >> 0x30));
  cVar16 = -(cStack_1a9 == (char)((ulong)local_1a0 >> 0x38));
  cVar17 = -(cStack_1a8 == (char)uStack_198);
  cVar18 = -(cStack_1a7 == (char)((ulong)uStack_198 >> 8));
  cVar19 = -(cStack_1a6 == (char)((ulong)uStack_198 >> 0x10));
  cVar20 = -(cStack_1a5 == (char)((ulong)uStack_198 >> 0x18));
  cVar21 = -(cStack_1a4 == (char)((ulong)uStack_198 >> 0x20));
  cVar22 = -(cStack_1a3 == (char)((ulong)uStack_198 >> 0x28));
  cVar23 = -(cStack_1a2 == (char)((ulong)uStack_198 >> 0x30));
  bVar7 = -(cStack_1a1 == (char)((ulong)uStack_198 >> 0x38));
  auVar1[1] = cVar10;
  auVar1[0] = cVar9;
  auVar1[2] = cVar11;
  auVar1[3] = cVar12;
  auVar1[4] = cVar13;
  auVar1[5] = cVar14;
  auVar1[6] = cVar15;
  auVar1[7] = cVar16;
  auVar1[8] = cVar17;
  auVar1[9] = cVar18;
  auVar1[10] = cVar19;
  auVar1[0xb] = cVar20;
  auVar1[0xc] = cVar21;
  auVar1[0xd] = cVar22;
  auVar1[0xe] = cVar23;
  auVar1[0xf] = bVar7;
  auVar2[1] = cVar10;
  auVar2[0] = cVar9;
  auVar2[2] = cVar11;
  auVar2[3] = cVar12;
  auVar2[4] = cVar13;
  auVar2[5] = cVar14;
  auVar2[6] = cVar15;
  auVar2[7] = cVar16;
  auVar2[8] = cVar17;
  auVar2[9] = cVar18;
  auVar2[10] = cVar19;
  auVar2[0xb] = cVar20;
  auVar2[0xc] = cVar21;
  auVar2[0xd] = cVar22;
  auVar2[0xe] = cVar23;
  auVar2[0xf] = bVar7;
  auVar6[1] = cVar12;
  auVar6[0] = cVar11;
  auVar6[2] = cVar13;
  auVar6[3] = cVar14;
  auVar6[4] = cVar15;
  auVar6[5] = cVar16;
  auVar6[6] = cVar17;
  auVar6[7] = cVar18;
  auVar6[8] = cVar19;
  auVar6[9] = cVar20;
  auVar6[10] = cVar21;
  auVar6[0xb] = cVar22;
  auVar6[0xc] = cVar23;
  auVar6[0xd] = bVar7;
  auVar5[1] = cVar13;
  auVar5[0] = cVar12;
  auVar5[2] = cVar14;
  auVar5[3] = cVar15;
  auVar5[4] = cVar16;
  auVar5[5] = cVar17;
  auVar5[6] = cVar18;
  auVar5[7] = cVar19;
  auVar5[8] = cVar20;
  auVar5[9] = cVar21;
  auVar5[10] = cVar22;
  auVar5[0xb] = cVar23;
  auVar5[0xc] = bVar7;
  auVar4[1] = cVar14;
  auVar4[0] = cVar13;
  auVar4[2] = cVar15;
  auVar4[3] = cVar16;
  auVar4[4] = cVar17;
  auVar4[5] = cVar18;
  auVar4[6] = cVar19;
  auVar4[7] = cVar20;
  auVar4[8] = cVar21;
  auVar4[9] = cVar22;
  auVar4[10] = cVar23;
  auVar4[0xb] = bVar7;
  auVar3[1] = cVar15;
  auVar3[0] = cVar14;
  auVar3[2] = cVar16;
  auVar3[3] = cVar17;
  auVar3[4] = cVar18;
  auVar3[5] = cVar19;
  auVar3[6] = cVar20;
  auVar3[7] = cVar21;
  auVar3[8] = cVar22;
  auVar3[9] = cVar23;
  auVar3[10] = bVar7;
  if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
               (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 | (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
               (ushort)((byte)(CONCAT19(bVar7,CONCAT18(cVar23,CONCAT17(cVar22,CONCAT16(cVar21,
                                                  CONCAT15(cVar20,CONCAT14(cVar19,CONCAT13(cVar18,
                                                  CONCAT12(cVar17,CONCAT11(cVar16,cVar15))))))))) >>
                              7) & 1) << 6 |
               (ushort)((byte)(CONCAT18(bVar7,CONCAT17(cVar23,CONCAT16(cVar22,CONCAT15(cVar21,
                                                  CONCAT14(cVar20,CONCAT13(cVar19,CONCAT12(cVar18,
                                                  CONCAT11(cVar17,cVar16)))))))) >> 7) & 1) << 7 |
              (ushort)(bVar7 >> 7) << 0xf) != 0xffff) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1c1,"test_bson_iter_overwrite_decimal128",
            "memcmp (&iter_value, &new_value, sizeof (new_value)) == 0");
    abort();
  }
  bson_destroy(local_180);
  return;
}

Assistant:

static void
test_bson_iter_overwrite_decimal128 (void)
{
   bson_iter_t iter;
   bson_t b;
   bson_decimal128_t value;
   bson_decimal128_t new_value;
   bson_decimal128_t iter_value;

   value.high = 0;
   value.low = 1;

   new_value.high = 0;
   new_value.low = 2;

   bson_init (&b);
   BSON_ASSERT (bson_append_decimal128 (&b, "key", -1, &value));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DECIMAL128 (&iter));
   bson_iter_overwrite_decimal128 (&iter, &new_value);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DECIMAL128 (&iter));
   BSON_ASSERT (bson_iter_decimal128 (&iter, &iter_value));
   BSON_ASSERT (memcmp (&iter_value, &new_value, sizeof (new_value)) == 0);
   bson_destroy (&b);
}